

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O3

void __thiscall
btMultiBody::setupSpherical
          (btMultiBody *this,int i,btScalar mass,btVector3 *inertia,int parent,
          btQuaternion *rotParentToThis,btVector3 *parentComToThisPivotOffset,
          btVector3 *thisPivotToThisComOffset,bool disableParentCollision)

{
  int *piVar1;
  btVector3 *pbVar2;
  btQuaternion *pbVar3;
  btScalar *pbVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar8;
  undefined8 uVar7;
  btMultibodyLink *pbVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  btSpatialMotionVector *pbVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  int iVar18;
  undefined1 auVar17 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  uVar6 = this->m_dofCount;
  uVar8 = this->m_posVarCnt;
  this->m_dofCount = uVar6 + 3;
  this->m_posVarCnt = uVar8 + 4;
  pbVar9 = (this->m_links).m_data;
  pbVar9[i].m_mass = mass;
  uVar7 = *(undefined8 *)(inertia->m_floats + 2);
  pbVar2 = &pbVar9[i].m_inertiaLocal;
  *(undefined8 *)pbVar2->m_floats = *(undefined8 *)inertia->m_floats;
  *(undefined8 *)(pbVar2->m_floats + 2) = uVar7;
  pbVar9 = (this->m_links).m_data;
  pbVar9[i].m_parent = parent;
  uVar7 = *(undefined8 *)((rotParentToThis->super_btQuadWord).m_floats + 2);
  pbVar3 = &pbVar9[i].m_zeroRotParentToThis;
  *(undefined8 *)(pbVar3->super_btQuadWord).m_floats =
       *(undefined8 *)(rotParentToThis->super_btQuadWord).m_floats;
  *(undefined8 *)((pbVar3->super_btQuadWord).m_floats + 2) = uVar7;
  uVar7 = *(undefined8 *)(thisPivotToThisComOffset->m_floats + 2);
  pbVar2 = &(this->m_links).m_data[i].m_dVector;
  *(undefined8 *)pbVar2->m_floats = *(undefined8 *)thisPivotToThisComOffset->m_floats;
  *(undefined8 *)(pbVar2->m_floats + 2) = uVar7;
  uVar7 = *(undefined8 *)(parentComToThisPivotOffset->m_floats + 2);
  pbVar2 = &(this->m_links).m_data[i].m_eVector;
  *(undefined8 *)pbVar2->m_floats = *(undefined8 *)parentComToThisPivotOffset->m_floats;
  *(undefined8 *)(pbVar2->m_floats + 2) = uVar7;
  pbVar9 = (this->m_links).m_data;
  pbVar9[i].m_jointType = eSpherical;
  pbVar9[i].m_dofCount = 3;
  pbVar9[i].m_posVarCount = 4;
  auVar17._0_12_ = ZEXT812(0x3f800000);
  auVar17._12_4_ = 0;
  *(undefined1 (*) [16])pbVar9[i].m_axes[0].m_topVec.m_floats = auVar17;
  pbVar13 = pbVar9[i].m_axes;
  pbVar13[1].m_topVec.m_floats[0] = 0.0;
  pbVar13[1].m_topVec.m_floats[1] = 1.0;
  pbVar13[1].m_topVec.m_floats[2] = 0.0;
  pbVar13[1].m_topVec.m_floats[3] = 0.0;
  pbVar13 = pbVar9[i].m_axes;
  pbVar13[2].m_topVec.m_floats[0] = 0.0;
  pbVar13[2].m_topVec.m_floats[1] = 0.0;
  pbVar13[2].m_topVec.m_floats[2] = 1.0;
  pbVar13[2].m_topVec.m_floats[3] = 0.0;
  auVar10._4_4_ =
       thisPivotToThisComOffset->m_floats[0] * 0.0 + -thisPivotToThisComOffset->m_floats[2];
  auVar10._0_4_ =
       thisPivotToThisComOffset->m_floats[2] * 0.0 + thisPivotToThisComOffset->m_floats[1] * -0.0;
  auVar10._8_4_ =
       thisPivotToThisComOffset->m_floats[0] * -0.0 + thisPivotToThisComOffset->m_floats[1];
  auVar10._12_4_ = 0;
  *(undefined1 (*) [16])pbVar9[i].m_axes[0].m_bottomVec.m_floats = auVar10;
  pbVar9 = (this->m_links).m_data;
  fVar5 = pbVar9[i].m_axes[1].m_topVec.m_floats[0];
  uVar7 = *(undefined8 *)(pbVar9[i].m_axes[1].m_topVec.m_floats + 1);
  fVar19 = (float)uVar7;
  fVar20 = (float)((ulong)uVar7 >> 0x20);
  fVar21 = (float)*(undefined8 *)(thisPivotToThisComOffset->m_floats + 1);
  fVar22 = (float)((ulong)*(undefined8 *)(thisPivotToThisComOffset->m_floats + 1) >> 0x20);
  auVar11._4_4_ = thisPivotToThisComOffset->m_floats[0] * fVar20 - fVar5 * fVar22;
  auVar11._0_4_ = fVar22 * fVar19 - fVar20 * fVar21;
  auVar11._8_4_ = fVar5 * fVar21 - thisPivotToThisComOffset->m_floats[0] * fVar19;
  auVar11._12_4_ = 0;
  *(undefined1 (*) [16])pbVar9[i].m_axes[1].m_bottomVec.m_floats = auVar11;
  pbVar9 = (this->m_links).m_data;
  fVar5 = pbVar9[i].m_axes[2].m_topVec.m_floats[0];
  uVar7 = *(undefined8 *)(pbVar9[i].m_axes[2].m_topVec.m_floats + 1);
  fVar19 = (float)uVar7;
  fVar20 = (float)((ulong)uVar7 >> 0x20);
  fVar21 = (float)*(undefined8 *)(thisPivotToThisComOffset->m_floats + 1);
  fVar22 = (float)((ulong)*(undefined8 *)(thisPivotToThisComOffset->m_floats + 1) >> 0x20);
  auVar12._4_4_ = thisPivotToThisComOffset->m_floats[0] * fVar20 - fVar5 * fVar22;
  auVar12._0_4_ = fVar22 * fVar19 - fVar20 * fVar21;
  auVar12._8_4_ = fVar5 * fVar21 - thisPivotToThisComOffset->m_floats[0] * fVar19;
  auVar12._12_4_ = 0;
  *(undefined1 (*) [16])pbVar9[i].m_axes[2].m_bottomVec.m_floats = auVar12;
  pbVar9 = (this->m_links).m_data;
  pbVar4 = pbVar9[i].m_jointPos;
  pbVar4[0] = 0.0;
  pbVar4[1] = 0.0;
  pbVar4[2] = 0.0;
  pbVar4[3] = 1.0;
  pbVar9[i].m_jointTorque[2] = 0.0;
  pbVar9[i].m_jointTorque[0] = 0.0;
  pbVar9[i].m_jointTorque[1] = 0.0;
  if (disableParentCollision) {
    piVar1 = &pbVar9[i].m_flags;
    *(byte *)piVar1 = (byte)*piVar1 | 1;
  }
  btMultibodyLink::updateCacheMultiDof(pbVar9 + i,(btScalar *)0x0);
  lVar14 = (long)(this->m_links).m_size;
  if (0 < lVar14) {
    pbVar9 = (this->m_links).m_data;
    iVar16 = 0;
    iVar18 = 0;
    lVar15 = 0;
    do {
      piVar1 = (int *)((long)(pbVar9->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                      lVar15 + -8);
      *piVar1 = iVar16;
      piVar1[1] = iVar18;
      uVar7 = *(undefined8 *)
               ((long)(pbVar9->m_cachedWorldTransform).m_basis.m_el[0].m_floats + lVar15 + -0x14);
      iVar16 = iVar16 + (int)uVar7;
      iVar18 = iVar18 + (int)((ulong)uVar7 >> 0x20);
      lVar15 = lVar15 + 600;
    } while (lVar14 * 600 - lVar15 != 0);
  }
  return;
}

Assistant:

void btMultiBody::setupSpherical(int i,
						   btScalar mass,
						   const btVector3 &inertia,
						   int parent,
						   const btQuaternion &rotParentToThis,
						   const btVector3 &parentComToThisPivotOffset,
						   const btVector3 &thisPivotToThisComOffset,
						   bool disableParentCollision)
{
	
	m_dofCount += 3;
	m_posVarCnt += 4;

	m_links[i].m_mass = mass;
    m_links[i].m_inertiaLocal = inertia;
    m_links[i].m_parent = parent;
    m_links[i].m_zeroRotParentToThis = rotParentToThis;    
    m_links[i].m_dVector = thisPivotToThisComOffset;
    m_links[i].m_eVector = parentComToThisPivotOffset;    

	m_links[i].m_jointType = btMultibodyLink::eSpherical;
	m_links[i].m_dofCount = 3;
	m_links[i].m_posVarCount = 4;
	m_links[i].setAxisTop(0, 1.f, 0.f, 0.f);
	m_links[i].setAxisTop(1, 0.f, 1.f, 0.f);
	m_links[i].setAxisTop(2, 0.f, 0.f, 1.f);
	m_links[i].setAxisBottom(0, m_links[i].getAxisTop(0).cross(thisPivotToThisComOffset));
	m_links[i].setAxisBottom(1, m_links[i].getAxisTop(1).cross(thisPivotToThisComOffset));
	m_links[i].setAxisBottom(2, m_links[i].getAxisTop(2).cross(thisPivotToThisComOffset));
	m_links[i].m_jointPos[0] = m_links[i].m_jointPos[1] = m_links[i].m_jointPos[2] = 0.f; m_links[i].m_jointPos[3] = 1.f;
	m_links[i].m_jointTorque[0] = m_links[i].m_jointTorque[1] = m_links[i].m_jointTorque[2] = 0.f;


	if (disableParentCollision)
		m_links[i].m_flags |=BT_MULTIBODYLINKFLAGS_DISABLE_PARENT_COLLISION;    
	//
	m_links[i].updateCacheMultiDof();	
	//
	updateLinksDofOffsets();
}